

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O3

void __thiscall
wabt::Stream::WriteMemoryDump
          (Stream *this,void *start,size_t size,size_t offset,PrintChars print_chars,char *prefix,
          char *desc)

{
  int iVar1;
  byte *pbVar2;
  uint32_t value;
  byte *pbVar3;
  byte *pbVar4;
  bool bVar5;
  uint uVar6;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  pbVar2 = (byte *)(size + (long)start);
  if (pbVar2 <= start) {
    return;
  }
  pbVar3 = (byte *)start;
LAB_00f4fcbe:
  if (prefix != (char *)0x0) {
    Writef(this,"%s",prefix);
  }
  Writef(this,"%07zx: ",pbVar3 + (offset - (long)start));
  pbVar4 = pbVar3;
  if (pbVar3 < pbVar3 + 0x10) {
    bVar5 = true;
    do {
      if (pbVar4 < pbVar2) {
        Writef(this,"%02x",(ulong)*pbVar4);
      }
      else {
        local_32 = 0x20;
        WriteData(this,&local_32,1,(char *)0x0,No);
        local_33 = 0x20;
        WriteData(this,&local_33,1,(char *)0x0,No);
      }
      if (!bVar5) {
        local_31 = 0x20;
        WriteData(this,&local_31,1,(char *)0x0,No);
        if (pbVar3 + 0x10 <= pbVar4 + 1) goto LAB_00f4fd98;
      }
      bVar5 = (bool)(bVar5 ^ 1);
      pbVar4 = pbVar4 + 1;
    } while( true );
  }
  goto LAB_00f4fda5;
LAB_00f4fd98:
  pbVar4 = pbVar4 + 1;
LAB_00f4fda5:
  if (print_chars == Yes) {
    local_34 = 0x20;
    WriteData(this,&local_34,1,(char *)0x0,No);
    pbVar4 = pbVar3;
    if (pbVar3 < pbVar2) {
      uVar6 = 0;
      do {
        value = (uint32_t)(char)*pbVar4;
        iVar1 = isprint((uint)*pbVar4);
        if (iVar1 == 0) {
          value = 0x2e;
        }
        WriteU8(this,value,(char *)0x0,No);
        pbVar4 = pbVar4 + 1;
      } while ((uVar6 < 0xf) && (uVar6 = uVar6 + 1, pbVar4 < pbVar2));
    }
  }
  if ((desc != (char *)0x0) && (pbVar2 <= pbVar4)) {
    Writef(this,"  ; %s",desc);
  }
  local_35 = 10;
  WriteData(this,&local_35,1,(char *)0x0,No);
  pbVar3 = pbVar4;
  if (pbVar2 <= pbVar4) {
    return;
  }
  goto LAB_00f4fcbe;
}

Assistant:

void Stream::WriteMemoryDump(const void* start,
                             size_t size,
                             size_t offset,
                             PrintChars print_chars,
                             const char* prefix,
                             const char* desc) {
  const uint8_t* p = static_cast<const uint8_t*>(start);
  const uint8_t* end = p + size;
  while (p < end) {
    const uint8_t* line = p;
    const uint8_t* line_end = p + DUMP_OCTETS_PER_LINE;
    if (prefix) {
      Writef("%s", prefix);
    }
    Writef("%07" PRIzx ": ", reinterpret_cast<intptr_t>(p) -
                                 reinterpret_cast<intptr_t>(start) + offset);
    while (p < line_end) {
      for (int i = 0; i < DUMP_OCTETS_PER_GROUP; ++i, ++p) {
        if (p < end) {
          Writef("%02x", *p);
        } else {
          WriteChar(' ');
          WriteChar(' ');
        }
      }
      WriteChar(' ');
    }

    if (print_chars == PrintChars::Yes) {
      WriteChar(' ');
      p = line;
      for (int i = 0; i < DUMP_OCTETS_PER_LINE && p < end; ++i, ++p)
        WriteChar(isprint(*p) ? *p : '.');
    }

    /* if there are multiple lines, only print the desc on the last one */
    if (p >= end && desc) {
      Writef("  ; %s", desc);
    }
    WriteChar('\n');
  }
}